

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

float * __thiscall cxxopts::OptionValue::as<float>(OptionValue *this)

{
  bool bVar1;
  string *psVar2;
  element_type *peVar3;
  long lVar4;
  float *pfVar5;
  long *in_RDI;
  abstract_value<float> *in_stack_ffffffffffffff98;
  __shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffb0;
  OptionNames *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffd0;
  byte bVar6;
  _Alloc_hider in_stack_ffffffffffffffd7;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::operator==((shared_ptr<cxxopts::Value> *)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
  if (bVar1) {
    bVar6 = 0;
    if (*in_RDI == 0) {
      in_stack_ffffffffffffffb0 = (string *)&stack0xffffffffffffffd7;
      std::allocator<char>::allocator();
      bVar6 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffffd7,CONCAT16(1,in_stack_ffffffffffffffd0)));
    }
    else {
      psVar2 = first_or_empty(in_stack_ffffffffffffffc0);
      std::__cxx11::string::string((string *)&stack0xffffffffffffffd8,(string *)psVar2);
    }
    throw_or_mimic<cxxopts::exceptions::option_has_no_value>(in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
    if ((bVar6 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
    }
  }
  peVar3 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(in_stack_ffffffffffffffa0);
  lVar4 = __dynamic_cast(peVar3,&Value::typeinfo,&values::standard_value<float>::typeinfo,0);
  if (lVar4 != 0) {
    pfVar5 = values::abstract_value<float>::get(in_stack_ffffffffffffff98);
    return pfVar5;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
  as() const
  {
    if (m_value == nullptr) {
        throw_or_mimic<exceptions::option_has_no_value>(
            m_long_names == nullptr ? "" : first_or_empty(*m_long_names));
    }

    return CXXOPTS_RTTI_CAST<const values::standard_value<T>&>(*m_value).get();
  }